

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O3

void lws_accept_modulation(lws_context *context,lws_context_per_thread *pt,int allow)

{
  lws *wsi;
  lws_vhost *vh;
  bool bVar1;
  lws_pollargs pa1;
  lws_pollargs local_24;
  
  if (context != (lws_context *)0x0) {
    do {
      wsi = *(lws **)&context->system_blobs[6].is_direct;
      if (wsi != (lws *)0x0) {
        bVar1 = (int)pt == 0;
        _lws_change_pollfd(wsi,(uint)bVar1,(uint)!bVar1,&local_24);
      }
      context = (lws_context *)context->system_blobs[6].u.bl;
    } while (context != (lws_context *)0x0);
  }
  return;
}

Assistant:

static void
lws_accept_modulation(struct lws_context *context,
		      struct lws_context_per_thread *pt, int allow)
{
	struct lws_vhost *vh = context->vhost_list;
	struct lws_pollargs pa1;

	while (vh) {
		if (vh->lserv_wsi) {
			if (allow)
				_lws_change_pollfd(vh->lserv_wsi,
					   0, LWS_POLLIN, &pa1);
			else
				_lws_change_pollfd(vh->lserv_wsi,
					   LWS_POLLIN, 0, &pa1);
		}
		vh = vh->vhost_next;
	}
}